

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimum.cpp
# Opt level: O1

bool __thiscall Minimum<1>::propagate(Minimum<1> *this)

{
  IntVar *pIVar1;
  long *plVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  uint *puVar13;
  Clause *c;
  TrailElem local_40;
  
  lVar7 = (this->min_max).v;
  lVar6 = (long)(((this->y).var)->min).v;
  if (SBORROW8(lVar7,-lVar6) == lVar7 + lVar6 < 0) {
LAB_00154729:
    if (this->lower_change == true) {
      lVar6 = 0x7fffffffffffffff;
      iVar4 = this->sz;
      lVar7 = (long)iVar4;
      if (lVar7 < 1) {
        lVar6 = 0x7fffffffffffffff;
      }
      else {
        lVar9 = 0;
        do {
          lVar11 = (long)*(int *)(*(long *)((long)&this->x->var + lVar9) + 0x10);
          lVar12 = -lVar11;
          if (SBORROW8(lVar6,lVar12) != lVar6 + lVar11 < 0) {
            lVar12 = lVar6;
          }
          lVar6 = lVar12;
          lVar9 = lVar9 + 0x10;
        } while (lVar7 << 4 != lVar9);
      }
      lVar9 = (long)(((this->y).var)->max).v;
      lVar12 = -lVar9;
      if (lVar6 != lVar12 && SBORROW8(lVar6,lVar12) == lVar6 + lVar9 < 0) {
        if (so.lazy == true) {
          local_40.pt = (int *)malloc(lVar7 * 4 + 0xc);
          *local_40.pt = (*local_40.pt & 0xfcU) + iVar4 * 0x100 + 0x102;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)&local_40);
          puVar13 = (uint *)local_40.pt;
          if (0 < this->sz) {
            lVar7 = 0;
            uVar10 = 1;
            do {
              plVar2 = *(long **)((long)&this->x->var + lVar7);
              uVar5 = (**(code **)(*plVar2 + 0x60))(plVar2,-lVar6);
              if (*puVar13 >> 8 <= uVar10) goto LAB_0015496f;
              ((int *)puVar13)[uVar10 + 1] = uVar5;
              lVar7 = lVar7 + 0x10;
              bVar8 = (long)uVar10 < (long)this->sz;
              uVar10 = uVar10 + 1;
            } while (bVar8);
          }
        }
        else {
          puVar13 = (uint *)0x0;
        }
        pIVar1 = (this->y).var;
        iVar4 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xf])(pIVar1,-lVar6,puVar13,1)
        ;
        if ((char)iVar4 == '\0') goto LAB_0015495c;
      }
      iVar4 = (((this->y).var)->max).v;
      if (so.lazy == true) {
        local_40.pt = (int *)malloc(0x10);
        *local_40.pt = *local_40.pt & 0xfcU | 0x202;
        vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)&local_40);
        puVar13 = (uint *)local_40.pt;
        uVar5 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
        if (*puVar13 < 0x200) {
LAB_0015496f:
          abort();
        }
        ((int *)puVar13)[2] = uVar5;
      }
      else {
        puVar13 = (uint *)0x0;
      }
      if (0 < this->sz) {
        lVar7 = 0;
        lVar6 = 0;
        do {
          plVar2 = *(long **)((long)&this->x->var + lVar7);
          if ((iVar4 < (int)plVar2[2]) &&
             (cVar3 = (**(code **)(*plVar2 + 0x78))(plVar2,(long)iVar4,puVar13,1), cVar3 == '\0'))
          goto LAB_0015495c;
          lVar6 = lVar6 + 1;
          lVar7 = lVar7 + 0x10;
        } while (lVar6 < this->sz);
      }
    }
    bVar8 = true;
    if ((long)(((this->y).var)->max).v + (this->min_max).v == 0) {
      local_40.pt = (int *)&(this->super_Propagator).satisfied;
      local_40.x = (int)(this->super_Propagator).satisfied.v;
      local_40.sz = 1;
      vec<TrailElem>::push(&engine.trail,&local_40);
      (this->super_Propagator).satisfied.v = '\x01';
    }
  }
  else {
    if (so.lazy) {
      iVar4 = (*((this->x[(this->min_max_var).v].var)->super_Var).super_Branching._vptr_Branching[8]
              )();
      lVar6 = (long)iVar4 * 4 + 2;
    }
    else {
      lVar6 = 0;
    }
    pIVar1 = (this->y).var;
    iVar4 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xe])(pIVar1,-lVar7,lVar6,1);
    if ((char)iVar4 != '\0') goto LAB_00154729;
LAB_0015495c:
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool propagate() override {
		// make a less than or equal to min(max(x_i))
		setDom(y, setMax, min_max, x[min_max_var].getMaxLit());

		if (lower_change) {
			// make a greater than or equal to min(min(b_i))
			int64_t m = INT64_MAX;
			for (int i = 0; i < sz; i++) {
				const int64_t t = x[i].getMin();
				if (t < m) {
					m = t;
				}
			}
			if (y.setMinNotR(m)) {
				Clause* r = nullptr;
				if (so.lazy) {
					r = Reason_new(sz + 1);
					// Finesse lower bounds
					// Add reason ![y <= m-1] \/ [x_1 <= m-1] \/ ... \/ [x_n <= m-1]
					for (int i = 0; i < sz; i++) {
						(*r)[i + 1] = x[i].getFMinLit(m);
					}
					//					for (int i = 0; i < sz; i++) (*r)[i+1] = x[i].getLit(m-1, LR_LE);
				}
				if (!y.setMin(m, r)) {
					return false;
				}
			}

			// make b_i greater than or equal to min(a)
			m = y.getMin();
			Clause* r = nullptr;
			if (so.lazy) {
				r = Reason_new(2);
				(*r)[1] = y.getMinLit();
			}
			for (int i = 0; i < sz; i++) {
				if (x[i].setMinNotR(m)) {
					if (!x[i].setMin(m, r)) {
						return false;
					}
				}
			}
		}

		// Necessary and sufficient conditions for redundancy

		if (y.getMin() == min_max) {
			satisfied = true;
		}

		return true;
	}